

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> *
__thiscall
pstore::command_line::
parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
operator()(maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           *__return_storage_ptr__,
          parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          *this,string *v)

{
  pointer plVar1;
  __type_conflict1 _Var2;
  pointer plVar3;
  long lVar4;
  long lVar5;
  pointer __rhs;
  
  __rhs = (this->super_parser_base).literals_.
          super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
          ._M_impl.super__Vector_impl_data._M_start;
  plVar1 = (this->super_parser_base).literals_.
           super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)plVar1 - (long)__rhs;
  if (lVar4 == 0) {
LAB_0011c84a:
    maybe<std::__cxx11::string,void>::maybe<std::__cxx11::string_const&,void>
              ((maybe<std::__cxx11::string,void> *)__return_storage_ptr__,v);
  }
  else {
    for (lVar5 = lVar4 / 0x48 >> 2; plVar3 = __rhs, 0 < lVar5; lVar5 = lVar5 + -1) {
      _Var2 = std::operator==(v,&__rhs->name);
      if (_Var2) goto LAB_0011c845;
      _Var2 = std::operator==(v,&__rhs[1].name);
      plVar3 = __rhs + 1;
      if (_Var2) goto LAB_0011c845;
      _Var2 = std::operator==(v,&__rhs[2].name);
      plVar3 = __rhs + 2;
      if (_Var2) goto LAB_0011c845;
      _Var2 = std::operator==(v,&__rhs[3].name);
      plVar3 = __rhs + 3;
      if (_Var2) goto LAB_0011c845;
      __rhs = __rhs + 4;
      lVar4 = lVar4 + -0x120;
    }
    lVar4 = lVar4 / 0x48;
    if (lVar4 == 1) {
LAB_0011c828:
      _Var2 = std::operator==(v,&__rhs->name);
      plVar3 = __rhs;
      if (!_Var2) {
        plVar3 = plVar1;
      }
LAB_0011c845:
      if (plVar3 != plVar1) goto LAB_0011c84a;
    }
    else {
      if (lVar4 == 2) {
LAB_0011c815:
        _Var2 = std::operator==(v,&__rhs->name);
        plVar3 = __rhs;
        if (!_Var2) {
          __rhs = __rhs + 1;
          goto LAB_0011c828;
        }
        goto LAB_0011c845;
      }
      if (lVar4 == 3) {
        _Var2 = std::operator==(v,&__rhs->name);
        if (!_Var2) {
          __rhs = __rhs + 1;
          goto LAB_0011c815;
        }
        goto LAB_0011c845;
      }
    }
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 0x10) = 0;
    *(undefined8 *)__return_storage_ptr__ = 0;
    (__return_storage_ptr__->storage_).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 0x18) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

maybe<std::string> parser<std::string>::operator() (std::string const & v) const {
                // If this one of the literal strings?
                auto const begin = this->begin ();
                auto const end = this->end ();
                if (std::distance (begin, end) != 0) {
                    auto const pos = std::find_if (
                        begin, end, [&v] (literal const & lit) { return v == lit.name; });
                    if (pos == end) {
                        return nothing<std::string> ();
                    }
                }
                return just (v);
            }